

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O2

size_t cesl_ulong_to_str(unsigned_long value,char *dst_str,uint8_t base)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char cVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  char acStack_48 [72];
  
  uVar5 = CONCAT71(in_register_00000011,base) & 0xffffffff;
  for (sVar3 = 0; sVar3 == 0 || value != 0; sVar3 = sVar3 + 1) {
    cVar4 = (char)(value % uVar5);
    cVar1 = 'W';
    if (cVar4 < '\n') {
      cVar1 = '0';
    }
    acStack_48[sVar3] = cVar1 + cVar4;
    value = value / uVar5;
  }
  if (0 < (long)sVar3) {
    for (pcVar2 = acStack_48 + sVar3; acStack_48 < pcVar2; pcVar2 = pcVar2 + -1) {
      *dst_str = pcVar2[-1];
      dst_str = dst_str + 1;
    }
    *dst_str = '\0';
    return sVar3;
  }
  __assert_fail("(len > 0)&&(\"cesl_uint64_to_str negative lenght\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                ,0x91,"size_t cesl_uint64_to_str(uint64_t, char *, uint8_t)");
}

Assistant:

size_t cesl_ulong_to_str(unsigned long value, char* dst_str, uint8_t base)
{
#if (ULONG_MAX == UINT64_MAX)
    return cesl_uint64_to_str(value, dst_str, base);
#elif (ULONG_MAX == UINT32_MAX)
    return cesl_uint32_to_str(value, dst_str, base);
#else
#error cesl_uint_to_string__not_supported_on_this_platfform
#endif
}